

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

CURLcode send_telnet_data(connectdata *conn,char *buffer,ssize_t nread)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  pollfd local_70;
  pollfd pfd [1];
  ssize_t total_written;
  ssize_t bytes_written;
  char *pcStack_50;
  CURLcode result;
  uchar *outbuf;
  ssize_t outlen;
  ssize_t j;
  ssize_t i;
  ssize_t escapes;
  ssize_t nread_local;
  char *buffer_local;
  connectdata *conn_local;
  
  pcStack_50 = (char *)0x0;
  bytes_written._4_4_ = CURLE_OK;
  i = 0;
  for (j = 0; j < nread; j = j + 1) {
    if (buffer[j] == -1) {
      i = i + 1;
    }
  }
  outbuf = (uchar *)(nread + i);
  pcVar3 = buffer;
  escapes = nread;
  nread_local = (ssize_t)buffer;
  buffer_local = (char *)conn;
  if (outbuf != (uchar *)nread) {
    pcVar3 = (char *)(*Curl_cmalloc)(nread + i + 1);
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    outlen = 0;
    for (j = 0; j < escapes; j = j + 1) {
      pcVar3[outlen] = *(char *)(nread_local + j);
      lVar1 = outlen + 1;
      if (*(char *)(nread_local + j) == -1) {
        pcVar3[outlen + 1] = -1;
        lVar1 = outlen + 2;
      }
      outlen = lVar1;
    }
    pcVar3[outlen] = '\0';
  }
  pcStack_50 = pcVar3;
  pfd[0].fd = 0;
  pfd[0].events = 0;
  pfd[0].revents = 0;
  while (bytes_written._4_4_ == CURLE_OK && (long)pfd[0] < (long)outbuf) {
    local_70.fd = *(int *)(buffer_local + 600);
    local_70.events = 4;
    iVar2 = Curl_poll(&local_70,1,-1);
    if (iVar2 == -1 || iVar2 == 0) {
      bytes_written._4_4_ = CURLE_SEND_ERROR;
    }
    else {
      total_written = 0;
      bytes_written._4_4_ =
           Curl_write((connectdata *)buffer_local,*(curl_socket_t *)(buffer_local + 600),
                      pcStack_50 + (long)pfd[0],(long)outbuf - (long)pfd[0],&total_written);
      pfd[0] = total_written + pfd[0];
    }
  }
  if (pcStack_50 != (char *)nread_local) {
    (*Curl_cfree)(pcStack_50);
  }
  return bytes_written._4_4_;
}

Assistant:

static CURLcode send_telnet_data(struct connectdata *conn,
                                 char *buffer, ssize_t nread)
{
  ssize_t escapes, i, j, outlen;
  unsigned char *outbuf = NULL;
  CURLcode result = CURLE_OK;
  ssize_t bytes_written, total_written;

  /* Determine size of new buffer after escaping */
  escapes = 0;
  for(i = 0; i < nread; i++)
    if((unsigned char)buffer[i] == CURL_IAC)
      escapes++;
  outlen = nread + escapes;

  if(outlen == nread)
    outbuf = (unsigned char *)buffer;
  else {
    outbuf = malloc(nread + escapes + 1);
    if(!outbuf)
      return CURLE_OUT_OF_MEMORY;

    j = 0;
    for(i = 0; i < nread; i++) {
      outbuf[j++] = buffer[i];
      if((unsigned char)buffer[i] == CURL_IAC)
        outbuf[j++] = CURL_IAC;
    }
    outbuf[j] = '\0';
  }

  total_written = 0;
  while(!result && total_written < outlen) {
    /* Make sure socket is writable to avoid EWOULDBLOCK condition */
    struct pollfd pfd[1];
    pfd[0].fd = conn->sock[FIRSTSOCKET];
    pfd[0].events = POLLOUT;
    switch(Curl_poll(pfd, 1, -1)) {
      case -1:                    /* error, abort writing */
      case 0:                     /* timeout (will never happen) */
        result = CURLE_SEND_ERROR;
        break;
      default:                    /* write! */
        bytes_written = 0;
        result = Curl_write(conn, conn->sock[FIRSTSOCKET],
                            outbuf + total_written,
                            outlen - total_written,
                            &bytes_written);
        total_written += bytes_written;
        break;
    }
  }

  /* Free malloc copy if escaped */
  if(outbuf != (unsigned char *)buffer)
    free(outbuf);

  return result;
}